

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  const_reference pUVar4;
  uint uVar5;
  size_t sVar6;
  int index;
  
  iVar2 = SooRep::size((SooRep *)unknown_fields,
                       (undefined1  [16])
                       ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                       (undefined1  [16])0x4) == (undefined1  [16])0x0);
  index = 0;
  if (iVar2 < 1) {
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    do {
      pUVar4 = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
      if (pUVar4->type_ == 3) {
        uVar5 = pUVar4->number_ | 1;
        iVar2 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar5 = (uint)((pUVar4->data_).string_value)->_M_string_length;
        uVar3 = uVar5 | 1;
        iVar1 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        sVar6 = (long)(int)uVar5 + sVar6 + 4 + (ulong)(iVar2 * 9 + 0x49U >> 6) +
                (ulong)(iVar1 * 9 + 0x49U >> 6);
      }
      index = index + 1;
      iVar2 = SooRep::size((SooRep *)unknown_fields,
                           (undefined1  [16])
                           ((undefined1  [16])(unknown_fields->fields_).soo_rep_.field_0 &
                           (undefined1  [16])0x4) == (undefined1  [16])0x0);
    } while (index < iVar2);
  }
  return sVar6;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}